

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

void * fio_ls_remove(fio_ls_s *node)

{
  fio_ls_s *pfVar1;
  fio_ls_s *pfVar2;
  void *pvVar3;
  
  if ((node == (fio_ls_s *)0x0) || (pfVar1 = node->next, pfVar1 == node)) {
    pvVar3 = (void *)0x0;
  }
  else {
    pfVar2 = node->prev;
    pvVar3 = node->obj;
    pfVar1->prev = pfVar2;
    pfVar2->next = pfVar1;
    free(node);
  }
  return pvVar3;
}

Assistant:

FIO_FUNC inline void *fio_ls_remove(fio_ls_s *node) {
  if (!node || node->next == node) {
    /* never remove the list's head */
    return NULL;
  }
  const void *ret = node->obj;
  node->next->prev = node->prev;
  node->prev->next = node->next;
  FIO_FREE(node);
  return (void *)ret;
}